

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O0

void __thiscall Js::AsmJsEncoder::AddReloc(AsmJsEncoder *this,int labelOffset,BYTE *patchAddr)

{
  bool bVar1;
  undefined1 local_40 [8];
  EncoderRelocLabel newLabel;
  EncoderRelocLabel *label;
  BYTE *patchAddr_local;
  AsmJsEncoder *pAStack_10;
  int labelOffset_local;
  AsmJsEncoder *this_local;
  
  newLabel.relocList = (EncoderReloc *)0x0;
  patchAddr_local._4_4_ = labelOffset;
  pAStack_10 = this;
  bVar1 = JsUtil::
          BaseDictionary<int,_Js::AsmJsEncoder::EncoderRelocLabel,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>
                    (this->mRelocLabelMap,(int *)((long)&patchAddr_local + 4),
                     (EncoderRelocLabel **)&newLabel.relocList);
  if (bVar1) {
    EncoderReloc::New((EncoderRelocLabel *)newLabel.relocList,patchAddr,this->mPc,this->mLocalAlloc)
    ;
  }
  else {
    EncoderRelocLabel::EncoderRelocLabel((EncoderRelocLabel *)local_40);
    EncoderReloc::New((EncoderRelocLabel *)local_40,patchAddr,this->mPc,this->mLocalAlloc);
    JsUtil::
    BaseDictionary<int,_Js::AsmJsEncoder::EncoderRelocLabel,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew(this->mRelocLabelMap,(int *)((long)&patchAddr_local + 4),(EncoderRelocLabel *)local_40)
    ;
  }
  return;
}

Assistant:

void Js::AsmJsEncoder::AddReloc( const int labelOffset, BYTE* patchAddr )
    {
        EncoderRelocLabel* label = nullptr;
        if( mRelocLabelMap->TryGetReference( labelOffset, &label ) )
        {
            EncoderReloc::New( label, patchAddr, mPc, mLocalAlloc );
        }
        else
        {
            EncoderRelocLabel newLabel;
            EncoderReloc::New( &newLabel, patchAddr, mPc, mLocalAlloc );
            mRelocLabelMap->AddNew( labelOffset, newLabel );
        }
    }